

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectDrawSurface.cpp
# Opt level: O2

uint __thiscall nv::DirectDrawSurface::blockSize(DirectDrawSurface *this)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = (this->header).pf.fourcc;
  uVar2 = 8;
  if ((uVar1 != 0x31495441) && (uVar1 != 0x31545844)) {
    if (((uVar1 == 0x32495441) ||
        (((uVar1 == 0x32545844 || (uVar1 == 0x33545844)) || (uVar1 == 0x34545844)))) ||
       ((uVar1 == 0x42475852 || (uVar1 == 0x35545844)))) {
      return 0x10;
    }
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

uint DirectDrawSurface::blockSize() const
{
	switch(header.pf.fourcc)
	{
		case FOURCC_DXT1:
		case FOURCC_ATI1:
			return 8;
		case FOURCC_DXT2:
		case FOURCC_DXT3:
		case FOURCC_DXT4:
		case FOURCC_DXT5:
		case FOURCC_RXGB:
		case FOURCC_ATI2:
			return 16;
	};

	// Not a block image.
	return 0;
}